

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::rootdevice::~rootdevice(rootdevice *this)

{
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->upnp_connection).
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&this->path);
  ::std::__cxx11::string::~string((string *)&this->hostname);
  ::std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>::~vector
            (&(this->mapping).
              super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
            );
  ::std::__cxx11::string::~string((string *)&this->service_namespace);
  ::std::__cxx11::string::~string((string *)&this->control_url);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

upnp::rootdevice::~rootdevice() = default;